

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

int pbrt::Log2Int(double v)

{
  int iVar1;
  
  if (v < 1.0) {
    iVar1 = Log2Int(1.0 / v);
    return -iVar1;
  }
  return ((uint)((ulong)v >> 0x34) - 0x3ff) + (uint)(0x6a09e667f3bcc < ((ulong)v & 0xfffffffffffff))
  ;
}

Assistant:

PBRT_CPU_GPU
inline int Log2Int(double v) {
    DCHECK_GT(v, 0);
    if (v < 1)
        return -Log2Int(1 / v);
    // https://graphics.stanford.edu/~seander/bithacks.html#IntegerLog
    // (With an additional check of the significant to get round-to-nearest
    // rather than round down.)
    // midsignif = Significand(std::pow(2., 1.5))
    // i.e. grab the significand of a value halfway between two exponents,
    // in log space.
    const uint64_t midsignif = 0b110101000001001111001100110011111110011101111001101;
    return Exponent(v) + ((Significand(v) >= midsignif) ? 1 : 0);
}